

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

int stbi__create_png_image_raw
              (stbi__png *a,stbi_uc *raw,stbi__uint32 raw_len,int out_n,stbi__uint32 x,
              stbi__uint32 y,int depth,int color)

{
  ushort *puVar1;
  int iVar2;
  stbi__context *psVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  stbi_uc *psVar10;
  ulong uVar11;
  byte bVar12;
  stbi__uint32 sVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  stbi_uc *psVar18;
  uint uVar19;
  int iVar20;
  uint uVar21;
  int iVar22;
  long lVar23;
  byte bVar24;
  uint uVar25;
  byte bVar27;
  long lVar28;
  long lVar29;
  ulong uVar30;
  stbi_uc *psVar31;
  uint uVar32;
  ulong uVar33;
  byte *pbVar34;
  uint uVar35;
  stbi_uc *psVar36;
  byte *pbVar37;
  bool bVar38;
  ulong local_68;
  ulong local_60;
  ulong uVar26;
  
  bVar38 = depth == 0x10;
  uVar4 = x * out_n;
  uVar5 = uVar4 << bVar38;
  psVar3 = a->s;
  iVar2 = psVar3->img_n;
  uVar6 = iVar2 << bVar38;
  if (iVar2 + 1 != out_n && iVar2 != out_n) {
    __assert_fail("out_n == s->img_n || out_n == s->img_n+1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sienkiewiczkm[P]ltc_fitter/dependencies/stb/stb_image.h"
                  ,0x10c6,
                  "int stbi__create_png_image_raw(stbi__png *, stbi_uc *, stbi__uint32, int, stbi__uint32, stbi__uint32, int, int)"
                 );
  }
  psVar10 = (stbi_uc *)stbi__malloc_mad3(x,y,out_n << bVar38,0);
  a->out = psVar10;
  if (psVar10 == (stbi_uc *)0x0) {
    stbi__g_failure_reason = "outofmem";
    return 0;
  }
  uVar7 = iVar2 * x;
  uVar25 = uVar7 * depth + 7 >> 3;
  uVar26 = (ulong)uVar25;
  uVar8 = (uVar25 + 1) * y;
  if ((psVar3->img_x == x) && (psVar3->img_y == y)) {
    if (uVar8 == raw_len) {
LAB_00167d74:
      if (y == 0) {
joined_r0x001684da:
        if (depth != 0x10) {
          return 1;
        }
LAB_001684dc:
        if (uVar4 * y == 0) {
          return 1;
        }
        psVar10 = a->out;
        lVar14 = 0;
        do {
          puVar1 = (ushort *)(psVar10 + lVar14 * 2);
          *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
          lVar14 = lVar14 + 1;
        } while (uVar4 * y != (int)lVar14);
        return 1;
      }
      bVar24 = *raw;
      if (bVar24 < 5) {
        lVar14 = (long)iVar2;
        lVar15 = (long)(out_n << bVar38);
        iVar9 = x - 1;
        uVar11 = (ulong)y;
        psVar10 = a->out;
        lVar16 = -lVar15;
        lVar23 = -(ulong)uVar5;
        local_60 = 0;
        local_68 = (ulong)x;
        lVar29 = 0;
        do {
          if (depth < 8) {
            if (x < uVar25) {
              __assert_fail("img_width_bytes <= x",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sienkiewiczkm[P]ltc_fitter/dependencies/stb/stb_image.h"
                            ,0x10db,
                            "int stbi__create_png_image_raw(stbi__png *, stbi_uc *, stbi__uint32, int, stbi__uint32, stbi__uint32, int, int)"
                           );
            }
            psVar10 = psVar10 + (uVar4 - uVar25);
            uVar6 = 1;
            local_68 = uVar26;
          }
          if (lVar29 == 0) {
            bVar24 = ""[bVar24];
          }
          if (0 < (int)uVar6) {
            uVar30 = 0;
            do {
              switch(bVar24) {
              case 0:
              case 1:
              case 5:
              case 6:
                bVar12 = raw[uVar30 + 1];
                goto LAB_00167ec4;
              case 2:
              case 4:
                bVar12 = psVar10[uVar30 + lVar23];
                break;
              case 3:
                bVar12 = psVar10[uVar30 + lVar23] >> 1;
                break;
              default:
                goto switchD_00167eac_default;
              }
              bVar12 = bVar12 + raw[uVar30 + 1];
LAB_00167ec4:
              psVar10[uVar30] = bVar12;
switchD_00167eac_default:
              uVar30 = uVar30 + 1;
            } while (uVar6 != uVar30);
          }
          if (depth == 8) {
            lVar28 = (long)out_n;
            lVar17 = lVar14;
            if (iVar2 != out_n) {
              psVar10[lVar14] = 0xff;
            }
LAB_00167f23:
            raw = raw + lVar17 + 1;
          }
          else {
            if (depth == 0x10) {
              lVar17 = (long)(int)uVar6;
              lVar28 = lVar15;
              if (iVar2 != out_n) {
                psVar10[lVar17] = 0xff;
                psVar10[lVar17 + 1] = 0xff;
              }
              goto LAB_00167f23;
            }
            raw = raw + 2;
            lVar28 = 1;
          }
          psVar36 = psVar10 + lVar28;
          if (depth < 8 || iVar2 == out_n) {
            uVar8 = ((int)local_68 + -1) * uVar6;
            switch(bVar24) {
            case 0:
              memcpy(psVar36,raw,(long)(int)uVar8);
              break;
            case 1:
              if (0 < (int)uVar8) {
                uVar30 = 0;
                do {
                  psVar36[uVar30] = psVar10[uVar30 + (lVar28 - (int)uVar6)] + raw[uVar30];
                  uVar30 = uVar30 + 1;
                } while (uVar8 != uVar30);
              }
              break;
            case 2:
              if (0 < (int)uVar8) {
                uVar30 = 0;
                do {
                  psVar36[uVar30] = psVar36[uVar30 + lVar23] + raw[uVar30];
                  uVar30 = uVar30 + 1;
                } while (uVar8 != uVar30);
              }
              break;
            case 3:
              if (0 < (int)uVar8) {
                uVar30 = 0;
                do {
                  psVar36[uVar30] =
                       (char)((uint)psVar10[uVar30 + (lVar28 - (int)uVar6)] +
                              (uint)psVar36[uVar30 + lVar23] >> 1) + raw[uVar30];
                  uVar30 = uVar30 + 1;
                } while (uVar8 != uVar30);
              }
              break;
            case 4:
              if (0 < (int)uVar8) {
                pbVar37 = psVar10 + (lVar28 - (int)uVar6);
                uVar30 = 0;
                do {
                  bVar24 = *pbVar37;
                  bVar12 = psVar36[lVar23];
                  bVar27 = pbVar37[lVar23];
                  iVar20 = ((uint)bVar12 + (uint)bVar24) - (uint)bVar27;
                  uVar32 = iVar20 - (uint)bVar24;
                  uVar35 = -uVar32;
                  if (0 < (int)uVar32) {
                    uVar35 = uVar32;
                  }
                  uVar19 = iVar20 - (uint)bVar12;
                  uVar32 = -uVar19;
                  if (0 < (int)uVar19) {
                    uVar32 = uVar19;
                  }
                  uVar21 = iVar20 - (uint)bVar27;
                  uVar19 = -uVar21;
                  if (0 < (int)uVar21) {
                    uVar19 = uVar21;
                  }
                  if (uVar32 <= uVar19) {
                    bVar27 = bVar12;
                  }
                  if (uVar19 < uVar35) {
                    bVar24 = bVar27;
                  }
                  if (uVar32 < uVar35) {
                    bVar24 = bVar27;
                  }
                  *psVar36 = bVar24 + raw[uVar30];
                  uVar30 = uVar30 + 1;
                  pbVar37 = pbVar37 + 1;
                  psVar36 = psVar36 + 1;
                } while (uVar8 != uVar30);
              }
              break;
            case 5:
              if (0 < (int)uVar8) {
                uVar30 = 0;
                do {
                  psVar36[uVar30] = (psVar10[uVar30 + (lVar28 - (int)uVar6)] >> 1) + raw[uVar30];
                  uVar30 = uVar30 + 1;
                } while (uVar8 != uVar30);
              }
              break;
            case 6:
              if (0 < (int)uVar8) {
                uVar30 = 0;
                do {
                  psVar36[uVar30] = psVar10[uVar30 + (lVar28 - (int)uVar6)] + raw[uVar30];
                  uVar30 = uVar30 + 1;
                } while (uVar8 != uVar30);
              }
            }
            raw = raw + (int)uVar8;
LAB_0016845a:
            if (lVar29 + 1U == uVar11) {
              if (depth < 8) {
                if (y == 0) {
                  return 1;
                }
                uVar6 = x - 1;
                lVar14 = uVar4 - uVar26;
                lVar15 = (ulong)uVar6 + 1;
                uVar8 = 0;
                uVar30 = 0;
                do {
                  bVar24 = 1;
                  if (color == 0) {
                    bVar24 = ""[depth];
                  }
                  psVar10 = a->out;
                  pbVar34 = psVar10 + uVar5 * (int)uVar30;
                  pbVar37 = pbVar34 + (uVar4 - uVar26);
                  uVar33 = (ulong)uVar8;
                  if (depth == 4) {
                    uVar25 = uVar7;
                    if (1 < (int)uVar7) {
                      psVar36 = psVar10 + lVar14;
                      uVar35 = uVar7;
                      do {
                        psVar10[uVar33] = (psVar36[uVar33] >> 4) * bVar24;
                        psVar10[uVar33 + 1] = (psVar36[uVar33] & 0xf) * bVar24;
                        uVar25 = uVar35 - 2;
                        psVar36 = psVar36 + 1;
                        psVar10 = psVar10 + 2;
                        bVar38 = 3 < uVar35;
                        uVar35 = uVar25;
                      } while (bVar38);
                      pbVar37 = psVar36 + uVar33;
                      pbVar34 = psVar10 + uVar33;
                    }
                    if (uVar25 == 1) {
                      *pbVar34 = (*pbVar37 >> 4) * bVar24;
                    }
                  }
                  else if (depth == 2) {
                    uVar25 = uVar7;
                    if (3 < (int)uVar7) {
                      psVar36 = psVar10 + lVar14;
                      uVar35 = uVar7;
                      do {
                        psVar10[uVar33] = (psVar36[uVar33] >> 6) * bVar24;
                        psVar10[uVar33 + 1] = (psVar36[uVar33] >> 4 & 3) * bVar24;
                        psVar10[uVar33 + 2] = (psVar36[uVar33] >> 2 & 3) * bVar24;
                        psVar10[uVar33 + 3] = (psVar36[uVar33] & 3) * bVar24;
                        uVar25 = uVar35 - 4;
                        psVar36 = psVar36 + 1;
                        psVar10 = psVar10 + 4;
                        bVar38 = 7 < uVar35;
                        uVar35 = uVar25;
                      } while (bVar38);
                      pbVar37 = psVar36 + uVar33;
                      pbVar34 = psVar10 + uVar33;
                    }
                    if (((0 < (int)uVar25) && (*pbVar34 = (*pbVar37 >> 6) * bVar24, uVar25 != 1)) &&
                       (pbVar34[1] = (*pbVar37 >> 4 & 3) * bVar24, uVar25 == 3)) {
                      pbVar34[2] = (*pbVar37 >> 2 & 3) * bVar24;
                    }
                  }
                  else if (depth == 1) {
                    uVar25 = uVar7;
                    if (7 < (int)uVar7) {
                      psVar36 = psVar10 + lVar14;
                      uVar35 = uVar7;
                      do {
                        psVar10[uVar33] = (char)psVar36[uVar33] >> 7 & bVar24;
                        psVar10[uVar33 + 1] = (char)(psVar36[uVar33] * '\x02') >> 7 & bVar24;
                        psVar10[uVar33 + 2] = (char)(psVar36[uVar33] << 2) >> 7 & bVar24;
                        psVar10[uVar33 + 3] = (char)(psVar36[uVar33] << 3) >> 7 & bVar24;
                        psVar10[uVar33 + 4] = (char)(psVar36[uVar33] << 4) >> 7 & bVar24;
                        psVar10[uVar33 + 5] = (char)(psVar36[uVar33] << 5) >> 7 & bVar24;
                        psVar10[uVar33 + 6] = (char)(psVar36[uVar33] << 6) >> 7 & bVar24;
                        bVar12 = bVar24;
                        if ((psVar36[uVar33] & 1) == 0) {
                          bVar12 = 0;
                        }
                        psVar10[uVar33 + 7] = bVar12;
                        uVar25 = uVar35 - 8;
                        psVar36 = psVar36 + 1;
                        psVar10 = psVar10 + 8;
                        bVar38 = 0xf < uVar35;
                        uVar35 = uVar25;
                      } while (bVar38);
                      pbVar37 = psVar36 + uVar33;
                      pbVar34 = psVar10 + uVar33;
                    }
                    if (((((0 < (int)uVar25) &&
                          (*pbVar34 = (char)*pbVar37 >> 7 & bVar24, uVar25 != 1)) &&
                         ((pbVar34[1] = (char)(*pbVar37 * '\x02') >> 7 & bVar24, 2 < uVar25 &&
                          ((pbVar34[2] = (char)(*pbVar37 << 2) >> 7 & bVar24, uVar25 != 3 &&
                           (pbVar34[3] = (char)(*pbVar37 << 3) >> 7 & bVar24, 4 < uVar25)))))) &&
                        (pbVar34[4] = (char)(*pbVar37 << 4) >> 7 & bVar24, uVar25 != 5)) &&
                       (pbVar34[5] = (char)(*pbVar37 << 5) >> 7 & bVar24, uVar25 == 7)) {
                      pbVar34[6] = (char)(*pbVar37 << 6) >> 7 & bVar24;
                    }
                  }
                  if (iVar2 != out_n) {
                    psVar10 = a->out;
                    if (iVar2 == 1) {
                      lVar16 = lVar15;
                      if (-1 < (int)uVar6) {
                        do {
                          psVar10[lVar16 * 2 + (uVar33 - 1)] = 0xff;
                          psVar10[lVar16 * 2 + (uVar33 - 2)] = psVar10[lVar16 + (uVar33 - 1)];
                          lVar23 = lVar16 + -1;
                          bVar38 = 0 < lVar16;
                          lVar16 = lVar23;
                        } while (lVar23 != 0 && bVar38);
                      }
                    }
                    else {
                      if (iVar2 != 3) {
                        __assert_fail("img_n == 3",
                                      "/workspace/llm4binary/github/license_all_cmakelists_25/sienkiewiczkm[P]ltc_fitter/dependencies/stb/stb_image.h"
                                      ,0x1172,
                                      "int stbi__create_png_image_raw(stbi__png *, stbi_uc *, stbi__uint32, int, stbi__uint32, stbi__uint32, int, int)"
                                     );
                      }
                      if (-1 < (int)uVar6) {
                        psVar36 = psVar10 + (ulong)uVar6 * 3 + 2 + uVar33;
                        lVar16 = lVar15;
                        do {
                          psVar10[lVar16 * 4 + (uVar33 - 1)] = 0xff;
                          psVar10[lVar16 * 4 + (uVar33 - 2)] = *psVar36;
                          psVar10[lVar16 * 4 + (uVar33 - 3)] = psVar36[-1];
                          psVar10[lVar16 * 4 + (uVar33 - 4)] = psVar36[-2];
                          psVar36 = psVar36 + -3;
                          lVar23 = lVar16 + -1;
                          bVar38 = 0 < lVar16;
                          lVar16 = lVar23;
                        } while (lVar23 != 0 && bVar38);
                      }
                    }
                  }
                  uVar30 = uVar30 + 1;
                  uVar8 = uVar8 + uVar5;
                } while (uVar30 != uVar11);
                return 1;
              }
              goto joined_r0x001684da;
            }
          }
          else {
            if (iVar2 + 1 != out_n) {
              __assert_fail("img_n+1 == out_n",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sienkiewiczkm[P]ltc_fitter/dependencies/stb/stb_image.h"
                            ,0x1119,
                            "int stbi__create_png_image_raw(stbi__png *, stbi_uc *, stbi__uint32, int, stbi__uint32, stbi__uint32, int, int)"
                           );
            }
            switch(bVar24) {
            case 0:
              if (iVar9 != 0) {
                iVar20 = iVar9;
                do {
                  if (0 < (int)uVar6) {
                    uVar30 = 0;
                    do {
                      psVar36[uVar30] = raw[uVar30];
                      uVar30 = uVar30 + 1;
                    } while (uVar6 != uVar30);
                  }
                  psVar36[(int)uVar6] = 0xff;
                  raw = raw + (int)uVar6;
                  psVar36 = psVar36 + lVar15;
                  iVar20 = iVar20 + -1;
                } while (iVar20 != 0);
              }
              break;
            case 1:
              if (iVar9 != 0) {
                psVar10 = psVar10 + lVar28 + lVar16;
                iVar20 = iVar9;
                do {
                  if (0 < (int)uVar6) {
                    uVar30 = 0;
                    do {
                      psVar36[uVar30] = psVar10[uVar30] + raw[uVar30];
                      uVar30 = uVar30 + 1;
                    } while (uVar6 != uVar30);
                  }
                  psVar36[(int)uVar6] = 0xff;
                  raw = raw + (int)uVar6;
                  psVar36 = psVar36 + lVar15;
                  psVar10 = psVar10 + lVar15;
                  iVar20 = iVar20 + -1;
                } while (iVar20 != 0);
              }
              break;
            case 2:
              if (iVar9 != 0) {
                iVar20 = iVar9;
                do {
                  if (0 < (int)uVar6) {
                    uVar30 = 0;
                    do {
                      psVar36[uVar30] = psVar36[uVar30 + lVar23] + raw[uVar30];
                      uVar30 = uVar30 + 1;
                    } while (uVar6 != uVar30);
                  }
                  psVar36[(int)uVar6] = 0xff;
                  raw = raw + (int)uVar6;
                  psVar36 = psVar36 + lVar15;
                  iVar20 = iVar20 + -1;
                } while (iVar20 != 0);
              }
              break;
            case 3:
              if (iVar9 != 0) {
                iVar20 = iVar9;
                do {
                  if (0 < (int)uVar6) {
                    uVar30 = 0;
                    psVar10 = psVar36;
                    do {
                      *psVar10 = (char)((uint)psVar10[lVar16] + (uint)psVar10[lVar23] >> 1) +
                                 raw[uVar30];
                      uVar30 = uVar30 + 1;
                      psVar10 = psVar10 + 1;
                    } while (uVar6 != uVar30);
                  }
                  psVar36[(int)uVar6] = 0xff;
                  raw = raw + (int)uVar6;
                  psVar36 = psVar36 + lVar15;
                  iVar20 = iVar20 + -1;
                } while (iVar20 != 0);
              }
              break;
            case 4:
              if (iVar9 != 0) {
                psVar18 = psVar10 + lVar28 + lVar23;
                psVar31 = psVar10 + lVar28 + lVar16;
                psVar10 = psVar10 + lVar28 + (lVar16 - (ulong)uVar5);
                iVar20 = iVar9;
                do {
                  if (0 < (int)uVar6) {
                    uVar30 = 0;
                    do {
                      bVar24 = psVar31[uVar30];
                      bVar12 = psVar18[uVar30];
                      bVar27 = psVar10[uVar30];
                      iVar22 = ((uint)bVar12 + (uint)bVar24) - (uint)bVar27;
                      uVar35 = iVar22 - (uint)bVar24;
                      uVar8 = -uVar35;
                      if (0 < (int)uVar35) {
                        uVar8 = uVar35;
                      }
                      uVar32 = iVar22 - (uint)bVar12;
                      uVar35 = -uVar32;
                      if (0 < (int)uVar32) {
                        uVar35 = uVar32;
                      }
                      uVar19 = iVar22 - (uint)bVar27;
                      uVar32 = -uVar19;
                      if (0 < (int)uVar19) {
                        uVar32 = uVar19;
                      }
                      if (uVar35 <= uVar32) {
                        bVar27 = bVar12;
                      }
                      if (uVar32 < uVar8) {
                        bVar24 = bVar27;
                      }
                      if (uVar35 < uVar8) {
                        bVar24 = bVar27;
                      }
                      psVar36[uVar30] = bVar24 + raw[uVar30];
                      uVar30 = uVar30 + 1;
                    } while (uVar6 != uVar30);
                  }
                  psVar36[(int)uVar6] = 0xff;
                  raw = raw + (int)uVar6;
                  psVar36 = psVar36 + lVar15;
                  psVar18 = psVar18 + lVar15;
                  psVar31 = psVar31 + lVar15;
                  psVar10 = psVar10 + lVar15;
                  iVar20 = iVar20 + -1;
                } while (iVar20 != 0);
              }
              break;
            case 5:
              if (iVar9 != 0) {
                psVar10 = psVar10 + lVar28 + lVar16;
                iVar20 = iVar9;
                do {
                  if (0 < (int)uVar6) {
                    uVar30 = 0;
                    do {
                      psVar36[uVar30] = (psVar10[uVar30] >> 1) + raw[uVar30];
                      uVar30 = uVar30 + 1;
                    } while (uVar6 != uVar30);
                  }
                  psVar36[(int)uVar6] = 0xff;
                  raw = raw + (int)uVar6;
                  psVar36 = psVar36 + lVar15;
                  psVar10 = psVar10 + lVar15;
                  iVar20 = iVar20 + -1;
                } while (iVar20 != 0);
              }
              break;
            case 6:
              if (iVar9 != 0) {
                psVar10 = psVar10 + lVar28 + lVar16;
                iVar20 = iVar9;
                do {
                  if (0 < (int)uVar6) {
                    uVar30 = 0;
                    do {
                      psVar36[uVar30] = psVar10[uVar30] + raw[uVar30];
                      uVar30 = uVar30 + 1;
                    } while (uVar6 != uVar30);
                  }
                  psVar36[(int)uVar6] = 0xff;
                  raw = raw + (int)uVar6;
                  psVar36 = psVar36 + lVar15;
                  psVar10 = psVar10 + lVar15;
                  iVar20 = iVar20 + -1;
                } while (iVar20 != 0);
              }
            }
            if (depth != 0x10) goto LAB_0016845a;
            if (x != 0) {
              psVar10 = a->out + (long)(int)uVar6 + local_60 + 1;
              sVar13 = x;
              do {
                *psVar10 = 0xff;
                psVar10 = psVar10 + lVar15;
                sVar13 = sVar13 - 1;
              } while (sVar13 != 0);
              goto LAB_0016845a;
            }
            if (lVar29 + 1U == uVar11) goto LAB_001684dc;
          }
          lVar29 = lVar29 + 1;
          local_60 = (ulong)(uVar5 * (int)lVar29);
          psVar10 = a->out + local_60;
          bVar24 = *raw;
        } while (bVar24 < 5);
      }
      stbi__g_failure_reason = "invalid filter";
      return 0;
    }
  }
  else if (uVar8 <= raw_len) goto LAB_00167d74;
  stbi__g_failure_reason = "not enough pixels";
  return 0;
}

Assistant:

static int stbi__create_png_image_raw(stbi__png *a, stbi_uc *raw, stbi__uint32 raw_len, int out_n, stbi__uint32 x, stbi__uint32 y, int depth, int color)
{
   int bytes = (depth == 16? 2 : 1);
   stbi__context *s = a->s;
   stbi__uint32 i,j,stride = x*out_n*bytes;
   stbi__uint32 img_len, img_width_bytes;
   int k;
   int img_n = s->img_n; // copy it into a local for later

   int output_bytes = out_n*bytes;
   int filter_bytes = img_n*bytes;
   int width = x;

   STBI_ASSERT(out_n == s->img_n || out_n == s->img_n+1);
   a->out = (stbi_uc *) stbi__malloc_mad3(x, y, output_bytes, 0); // extra bytes to write off the end into
   if (!a->out) return stbi__err("outofmem", "Out of memory");

   img_width_bytes = (((img_n * x * depth) + 7) >> 3);
   img_len = (img_width_bytes + 1) * y;
   if (s->img_x == x && s->img_y == y) {
      if (raw_len != img_len) return stbi__err("not enough pixels","Corrupt PNG");
   } else { // interlaced:
      if (raw_len < img_len) return stbi__err("not enough pixels","Corrupt PNG");
   }

   for (j=0; j < y; ++j) {
      stbi_uc *cur = a->out + stride*j;
      stbi_uc *prior;
      int filter = *raw++;

      if (filter > 4)
         return stbi__err("invalid filter","Corrupt PNG");

      if (depth < 8) {
         STBI_ASSERT(img_width_bytes <= x);
         cur += x*out_n - img_width_bytes; // store output to the rightmost img_len bytes, so we can decode in place
         filter_bytes = 1;
         width = img_width_bytes;
      }
      prior = cur - stride; // bugfix: need to compute this after 'cur +=' computation above

      // if first row, use special filter that doesn't sample previous row
      if (j == 0) filter = first_row_filter[filter];

      // handle first byte explicitly
      for (k=0; k < filter_bytes; ++k) {
         switch (filter) {
            case STBI__F_none       : cur[k] = raw[k]; break;
            case STBI__F_sub        : cur[k] = raw[k]; break;
            case STBI__F_up         : cur[k] = STBI__BYTECAST(raw[k] + prior[k]); break;
            case STBI__F_avg        : cur[k] = STBI__BYTECAST(raw[k] + (prior[k]>>1)); break;
            case STBI__F_paeth      : cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(0,prior[k],0)); break;
            case STBI__F_avg_first  : cur[k] = raw[k]; break;
            case STBI__F_paeth_first: cur[k] = raw[k]; break;
         }
      }

      if (depth == 8) {
         if (img_n != out_n)
            cur[img_n] = 255; // first pixel
         raw += img_n;
         cur += out_n;
         prior += out_n;
      } else if (depth == 16) {
         if (img_n != out_n) {
            cur[filter_bytes]   = 255; // first pixel top byte
            cur[filter_bytes+1] = 255; // first pixel bottom byte
         }
         raw += filter_bytes;
         cur += output_bytes;
         prior += output_bytes;
      } else {
         raw += 1;
         cur += 1;
         prior += 1;
      }

      // this is a little gross, so that we don't switch per-pixel or per-component
      if (depth < 8 || img_n == out_n) {
         int nk = (width - 1)*filter_bytes;
         #define STBI__CASE(f) \
             case f:     \
                for (k=0; k < nk; ++k)
         switch (filter) {
            // "none" filter turns into a memcpy here; make that explicit.
            case STBI__F_none:         memcpy(cur, raw, nk); break;
            STBI__CASE(STBI__F_sub)          { cur[k] = STBI__BYTECAST(raw[k] + cur[k-filter_bytes]); } break;
            STBI__CASE(STBI__F_up)           { cur[k] = STBI__BYTECAST(raw[k] + prior[k]); } break;
            STBI__CASE(STBI__F_avg)          { cur[k] = STBI__BYTECAST(raw[k] + ((prior[k] + cur[k-filter_bytes])>>1)); } break;
            STBI__CASE(STBI__F_paeth)        { cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(cur[k-filter_bytes],prior[k],prior[k-filter_bytes])); } break;
            STBI__CASE(STBI__F_avg_first)    { cur[k] = STBI__BYTECAST(raw[k] + (cur[k-filter_bytes] >> 1)); } break;
            STBI__CASE(STBI__F_paeth_first)  { cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(cur[k-filter_bytes],0,0)); } break;
         }
         #undef STBI__CASE
         raw += nk;
      } else {
         STBI_ASSERT(img_n+1 == out_n);
         #define STBI__CASE(f) \
             case f:     \
                for (i=x-1; i >= 1; --i, cur[filter_bytes]=255,raw+=filter_bytes,cur+=output_bytes,prior+=output_bytes) \
                   for (k=0; k < filter_bytes; ++k)
         switch (filter) {
            STBI__CASE(STBI__F_none)         { cur[k] = raw[k]; } break;
            STBI__CASE(STBI__F_sub)          { cur[k] = STBI__BYTECAST(raw[k] + cur[k- output_bytes]); } break;
            STBI__CASE(STBI__F_up)           { cur[k] = STBI__BYTECAST(raw[k] + prior[k]); } break;
            STBI__CASE(STBI__F_avg)          { cur[k] = STBI__BYTECAST(raw[k] + ((prior[k] + cur[k- output_bytes])>>1)); } break;
            STBI__CASE(STBI__F_paeth)        { cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(cur[k- output_bytes],prior[k],prior[k- output_bytes])); } break;
            STBI__CASE(STBI__F_avg_first)    { cur[k] = STBI__BYTECAST(raw[k] + (cur[k- output_bytes] >> 1)); } break;
            STBI__CASE(STBI__F_paeth_first)  { cur[k] = STBI__BYTECAST(raw[k] + stbi__paeth(cur[k- output_bytes],0,0)); } break;
         }
         #undef STBI__CASE

         // the loop above sets the high byte of the pixels' alpha, but for
         // 16 bit png files we also need the low byte set. we'll do that here.
         if (depth == 16) {
            cur = a->out + stride*j; // start at the beginning of the row again
            for (i=0; i < x; ++i,cur+=output_bytes) {
               cur[filter_bytes+1] = 255;
            }
         }
      }